

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vhost.c
# Opt level: O0

int lws_protocol_init_vhost(lws_vhost *vh,int *any)

{
  int iVar1;
  lws_protocol_vhost_options *plVar2;
  lws_log_cx *plVar3;
  char *pcVar4;
  lws_protocol_vhost_options *local_4f0;
  lws_a *lwsa;
  lws _lws;
  int n;
  lws_protocol_vhost_options *pvo1;
  lws_protocol_vhost_options *pvo;
  int *any_local;
  lws_vhost *vh_local;
  
  memset(&lwsa,0,0x498);
  lwsa = (lws_a *)vh->context;
  _lws.leave_pollout_active = '\0';
  _lws._1173_3_ = 0;
  _lws.a.context = (lws_context *)vh;
  do {
    if (vh->count_protocols <= (int)_lws._1172_4_) {
      vh->field_0x368 = vh->field_0x368 & 0xfd | 2;
      return 0;
    }
    _lws.a.vhost = (lws_vhost *)(vh->protocols + (int)_lws._1172_4_);
    if (vh->protocols[(int)_lws._1172_4_].name != (char *)0x0) {
      plVar2 = lws_vhost_protocol_options(vh,vh->protocols[(int)_lws._1172_4_].name);
      if (plVar2 == (lws_protocol_vhost_options *)0x0) {
        plVar3 = lwsl_vhost_get_cx(vh);
        _lws_log_cx(plVar3,lws_log_prepend_vhost,vh,0x10,"lws_protocol_init_vhost",
                    "not instantiating %s",vh->protocols[(int)_lws._1172_4_].name);
      }
      else {
        for (pvo1 = plVar2->options; pvo1 != (lws_protocol_vhost_options *)0x0; pvo1 = pvo1->next) {
          plVar3 = lwsl_vhost_get_cx(vh);
          pcVar4 = pvo1->name;
          _lws_log_cx(plVar3,lws_log_prepend_vhost,vh,0x10,"lws_protocol_init_vhost",
                      "protocol \"%s\", option \"%s\"",vh->protocols[(int)_lws._1172_4_].name,pcVar4
                     );
          iVar1 = strcmp(pvo1->name,"default");
          if (iVar1 == 0) {
            plVar3 = lwsl_vhost_get_cx(vh);
            _lws_log_cx(plVar3,lws_log_prepend_vhost,vh,8,"lws_protocol_init_vhost",
                        "Setting default protocol to %s",vh->protocols[(int)_lws._1172_4_].name,
                        pcVar4);
            vh->default_protocol_index = _lws.leave_pollout_active;
          }
          iVar1 = strcmp(pvo1->name,"raw");
          if (iVar1 == 0) {
            plVar3 = lwsl_vhost_get_cx(vh);
            _lws_log_cx(plVar3,lws_log_prepend_vhost,vh,8,"lws_protocol_init_vhost",
                        "Setting raw protocol to %s",vh->protocols[(int)_lws._1172_4_].name);
            vh->raw_protocol_index = _lws.leave_pollout_active;
          }
        }
      }
      if (any != (int *)0x0) {
        *any = (uint)((vh->tls).ssl_ctx != (lws_tls_ctx *)0x0) | *any;
      }
      plVar2 = lws_vhost_protocol_options(vh,vh->protocols[(int)_lws._1172_4_].name);
      if ((plVar2 != (lws_protocol_vhost_options *)0x0) ||
         (vh->pvo == (lws_protocol_vhost_options *)0x0)) {
        plVar3 = lwsl_vhost_get_cx(vh);
        pcVar4 = vh->protocols[(int)_lws._1172_4_].name;
        _lws_log_cx(plVar3,lws_log_prepend_vhost,vh,8,"lws_protocol_init_vhost","init %s.%s",
                    vh->name,pcVar4);
        if (plVar2 == (lws_protocol_vhost_options *)0x0) {
          local_4f0 = (lws_protocol_vhost_options *)0x0;
        }
        else {
          local_4f0 = plVar2->options;
        }
        iVar1 = (*vh->protocols[(int)_lws._1172_4_].callback)
                          ((lws *)&lwsa,LWS_CALLBACK_PROTOCOL_INIT,(void *)0x0,local_4f0,0);
        if (iVar1 != 0) {
          if ((vh->protocol_vh_privs != (void **)0x0) &&
             (vh->protocol_vh_privs[(int)_lws._1172_4_] != (void *)0x0)) {
            lws_realloc(vh->protocol_vh_privs[(int)_lws._1172_4_],0,"lws_free");
            vh->protocol_vh_privs[(int)_lws._1172_4_] = (void *)0x0;
          }
          plVar3 = lwsl_vhost_get_cx(vh);
          _lws_log_cx(plVar3,lws_log_prepend_vhost,vh,1,"lws_protocol_init_vhost",
                      "protocol %s failed init",vh->protocols[(int)_lws._1172_4_].name,pcVar4);
          return 1;
        }
      }
    }
    _lws._1172_4_ = _lws._1172_4_ + 1;
  } while( true );
}

Assistant:

int
lws_protocol_init_vhost(struct lws_vhost *vh, int *any)
{
	const struct lws_protocol_vhost_options *pvo, *pvo1;
	int n;
#if defined(LWS_PLAT_FREERTOS)
	struct lws_a _lwsa, *lwsa = &_lwsa;

	memset(&_lwsa, 0, sizeof(_lwsa));
#else
	struct lws _lws;
	struct lws_a *lwsa = &_lws.a;

	memset(&_lws, 0, sizeof(_lws));
#endif

	lwsa->context = vh->context;
	lwsa->vhost = vh;

	/* initialize supported protocols on this vhost */

	for (n = 0; n < vh->count_protocols; n++) {
		lwsa->protocol = &vh->protocols[n];
		if (!vh->protocols[n].name)
			continue;
		pvo = lws_vhost_protocol_options(vh, vh->protocols[n].name);
		if (pvo) {
			/*
			 * linked list of options specific to
			 * vh + protocol
			 */
			pvo1 = pvo;
			pvo = pvo1->options;

			while (pvo) {
				lwsl_vhost_debug(vh, "protocol \"%s\", "
						     "option \"%s\"",
						     vh->protocols[n].name,
						     pvo->name);

				if (!strcmp(pvo->name, "default")) {
					lwsl_vhost_info(vh, "Setting default "
							     "protocol to %s",
							     vh->protocols[n].name);
					vh->default_protocol_index = (unsigned char)n;
				}
				if (!strcmp(pvo->name, "raw")) {
					lwsl_vhost_info(vh, "Setting raw "
							     "protocol to %s",
							     vh->protocols[n].name);
					vh->raw_protocol_index = (unsigned char)n;
				}
				pvo = pvo->next;
			}
		} else
			lwsl_vhost_debug(vh, "not instantiating %s",
					     vh->protocols[n].name);

#if defined(LWS_WITH_TLS)
		if (any)
			*any |= !!vh->tls.ssl_ctx;
#endif

		pvo = lws_vhost_protocol_options(vh, vh->protocols[n].name);

		/*
		 * inform all the protocols that they are doing their
		 * one-time initialization if they want to.
		 *
		 * NOTE the fakewsi is garbage, except the key pointers that are
		 * prepared in case the protocol handler wants to touch them
		 */

		if (pvo
#if !defined(LWS_WITH_PLUGINS)
				/*
				 * with plugins, you have to explicitly
				 * instantiate them per-vhost with pvos.
				 *
				 * Without plugins, not setting the vhost pvo
				 * list at creation enables all the protocols
				 * by default, for backwards compatibility
				 */
				|| !vh->pvo
#endif
		) {
			lwsl_vhost_info(vh, "init %s.%s", vh->name,
					vh->protocols[n].name);
			if (vh->protocols[n].callback((struct lws *)lwsa,
				LWS_CALLBACK_PROTOCOL_INIT, NULL,
#if !defined(LWS_WITH_PLUGINS)
				(void *)(pvo ? pvo->options : NULL),
#else
				(void *)pvo->options,
#endif
				0)) {
				if (vh->protocol_vh_privs && vh->protocol_vh_privs[n]) {
					lws_free(vh->protocol_vh_privs[n]);
					vh->protocol_vh_privs[n] = NULL;
				}
			lwsl_vhost_err(vh, "protocol %s failed init",
					vh->protocols[n].name);

				return 1;
			}
		}
	}

	vh->created_vhost_protocols = 1;

	return 0;
}